

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

int util::str_value<int>(string *str)

{
  bool bVar1;
  int iVar2;
  exception *this;
  char (*in_R8) [2];
  size_t idx_end;
  string local_58;
  string local_38;
  
  idx_end = 0;
  std::__cxx11::string::substr((ulong)&local_38,(ulong)str);
  lowercase(&local_58,&local_38);
  bVar1 = std::operator==(&local_58,"0x");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  iVar2 = 10;
  if (bVar1) {
    iVar2 = 0x10;
  }
  iVar2 = std::__cxx11::stoi(str,&idx_end,iVar2);
  if ((-1 < iVar2) && (idx_end == str->_M_string_length)) {
    return iVar2;
  }
  this = (exception *)__cxa_allocate_exception(0x10);
  format<char_const*,std::__cxx11::string_const&,char_const(&)[2]>
            (&local_58,(util *)"invalid value \'",(char *)str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1aace7,in_R8);
  exception::exception<std::__cxx11::string>(this,&local_58);
  __cxa_throw(this,&exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T str_value(const std::string& str)
{
    static_assert(std::is_same<T, int>::value || std::is_same<T, long>::value, "int or long only");
    try
    {
        size_t idx_end = 0;
        auto hex = util::lowercase(str.substr(0, 2)) == "0x";
        T n{};
        if (std::is_same<T, int>::value)
            n = std::stoi(str, &idx_end, hex ? 16 : 10);
        else
            n = std::stol(str, &idx_end, hex ? 16 : 10);
        if (idx_end == str.size() && n >= 0)
            return n;
    }
    catch (...)
    {
    }

    throw util::exception(util::format("invalid value '", str, "'"));
}